

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O2

void __thiscall
Am_Standard_Opal_Handlers::Frame_Resize_Notify
          (Am_Standard_Opal_Handlers *this,Am_Drawonable *draw,int left,int top,int right,int bottom
          )

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  Am_Object window;
  
  window.data = (Am_Object_Data *)draw->data_store;
  puVar1 = &((window.data)->super_Am_Wrapper).refs;
  *puVar1 = *puVar1 + 1;
  pAVar6 = Am_Object::Get(&window,0x7a,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(&window,0x7b,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(&window,0x7c,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(&window,0x7d,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar6);
  if (iVar2 != left) {
    Am_Object::Set(&window,0x7a,left,0);
  }
  if (iVar3 != top) {
    Am_Object::Set(&window,0x7b,top,0);
  }
  if (iVar4 != right) {
    Am_Object::Set(&window,0x7c,right,0);
  }
  if (iVar5 != bottom) {
    Am_Object::Set(&window,0x7d,bottom,0);
  }
  Am_Object::~Am_Object(&window);
  return;
}

Assistant:

void Frame_Resize_Notify(Am_Drawonable *draw, int left, int top, int right,
                           int bottom) override
  {
    Am_Wrapper *window_data = (Am_Wrapper *)draw->Get_Data_Store();
    window_data->Note_Reference();
    Am_Object window((Am_Object_Data *)window_data);
    ASSERT_WINDOW
    int w_left = window.Get(Am_LEFT_BORDER_WIDTH);
    int w_top = window.Get(Am_TOP_BORDER_WIDTH);
    int w_right = window.Get(Am_RIGHT_BORDER_WIDTH);
    int w_bottom = window.Get(Am_BOTTOM_BORDER_WIDTH);
    if (w_left != left)
      window.Set(Am_LEFT_BORDER_WIDTH, left);
    if (w_top != top)
      window.Set(Am_TOP_BORDER_WIDTH, top);
    if (w_right != right)
      window.Set(Am_RIGHT_BORDER_WIDTH, right);
    if (w_bottom != bottom)
      window.Set(Am_BOTTOM_BORDER_WIDTH, bottom);
  }